

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O2

void amqpvalue_destroy(AMQP_VALUE value)

{
  uint32_t *puVar1;
  void *__ptr;
  size_t i;
  size_t i_1;
  long lVar2;
  ulong uVar3;
  
  if (value == (AMQP_VALUE)0x0) {
    return;
  }
  puVar1 = &value[-1].value.binary_value.length;
  *puVar1 = *puVar1 - 1;
  if (*puVar1 != 0) {
    return;
  }
  switch(value->type) {
  case AMQP_TYPE_BINARY:
  case AMQP_TYPE_STRING:
  case AMQP_TYPE_SYMBOL:
    free((value->value).binary_value.bytes);
    goto switchD_00105337_default;
  case AMQP_TYPE_LIST:
    if ((value->value).described_value.descriptor == (AMQP_VALUE)0x0) goto switchD_00105337_default;
    for (uVar3 = 0; __ptr = (value->value).binary_value.bytes,
        uVar3 < (value->value).binary_value.length; uVar3 = uVar3 + 1) {
      amqpvalue_destroy(*(AMQP_VALUE *)((long)__ptr + uVar3 * 8));
    }
    break;
  case AMQP_TYPE_MAP:
    if ((value->value).described_value.descriptor == (AMQP_VALUE)0x0) goto switchD_00105337_default;
    lVar2 = 0;
    for (uVar3 = 0; __ptr = (value->value).binary_value.bytes,
        uVar3 < (value->value).binary_value.length; uVar3 = uVar3 + 1) {
      amqpvalue_destroy(*(AMQP_VALUE *)((long)__ptr + lVar2));
      amqpvalue_destroy(*(AMQP_VALUE *)
                         ((long)&((value->value).described_value.descriptor)->value + lVar2));
      lVar2 = lVar2 + 0x10;
    }
    break;
  case AMQP_TYPE_ARRAY:
    if ((value->value).described_value.descriptor == (AMQP_VALUE)0x0) goto switchD_00105337_default;
    for (uVar3 = 0; __ptr = (value->value).binary_value.bytes,
        uVar3 < (value->value).binary_value.length; uVar3 = uVar3 + 1) {
      amqpvalue_destroy(*(AMQP_VALUE *)((long)__ptr + uVar3 * 8));
    }
    break;
  case AMQP_TYPE_DESCRIBED:
  case AMQP_TYPE_COMPOSITE:
    amqpvalue_destroy((value->value).described_value.descriptor);
    amqpvalue_destroy((value->value).described_value.value);
  default:
    goto switchD_00105337_default;
  }
  free(__ptr);
  (value->value).described_value.descriptor = (AMQP_VALUE)0x0;
switchD_00105337_default:
  value->type = AMQP_TYPE_UNKNOWN;
  free((void *)((long)&value[-1].value + 8));
  return;
}

Assistant:

void amqpvalue_destroy(AMQP_VALUE value)
{
    /* Codes_SRS_AMQPVALUE_01_315: [If the value argument is NULL, amqpvalue_destroy shall do nothing.] */
    if (value != NULL)
    {
        if (DEC_REF(AMQP_VALUE_DATA, value) == DEC_RETURN_ZERO)
        {
            /* Codes_SRS_AMQPVALUE_01_314: [amqpvalue_destroy shall free all resources allocated by any of the amqpvalue_create_xxx functions or amqpvalue_clone.] */
            AMQP_VALUE_DATA* value_data = (AMQP_VALUE_DATA*)value;
            amqpvalue_clear(value_data);
            REFCOUNT_TYPE_DESTROY(AMQP_VALUE_DATA, value);
        }
    }
}